

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

string * __thiscall
cmLBDepend::FullPath_abi_cxx11_
          (string *__return_storage_ptr__,cmLBDepend *this,char *fname,char *extraPath)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  string *psVar6;
  pointer pbVar7;
  char *pcVar8;
  allocator local_aa;
  allocator local_a9;
  string *local_a8;
  string path;
  key_type local_80;
  DirectoryToFileToPathMapType *local_60;
  char *local_58;
  key_type local_50;
  
  local_a8 = __return_storage_ptr__;
  local_58 = extraPath;
  if (extraPath == (char *)0x0) {
    std::__cxx11::string::string((string *)&path,"",(allocator *)&local_80);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::find(&(this->DirectoryToFileToPathMap)._M_t,&path);
  }
  else {
    std::__cxx11::string::string((string *)&path,extraPath,(allocator *)&local_80);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::find(&(this->DirectoryToFileToPathMap)._M_t,&path);
  }
  std::__cxx11::string::~string((string *)&path);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&path,fname,(allocator *)&local_80);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(iVar2._M_node + 2,&path);
    std::__cxx11::string::~string((string *)&path);
    psVar6 = local_a8;
    if (iVar3._M_node != (_Base_ptr)&iVar2._M_node[2]._M_parent) {
      std::__cxx11::string::string((string *)local_a8,(string *)(iVar3._M_node + 2));
      return psVar6;
    }
  }
  local_60 = &this->DirectoryToFileToPathMap;
  bVar1 = cmsys::SystemTools::FileExists(fname,true);
  if (bVar1) {
    std::__cxx11::string::string((string *)&path,fname,(allocator *)&local_80);
    cmsys::SystemTools::CollapseFullPath(local_a8,&path);
    std::__cxx11::string::~string((string *)&path);
    pcVar8 = "";
    if (local_58 != (char *)0x0) {
      pcVar8 = local_58;
    }
    std::__cxx11::string::string((string *)&path,pcVar8,(allocator *)&local_50);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             ::operator[](local_60,&path);
    std::__cxx11::string::string((string *)&local_80,fname,&local_aa);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar4,&local_80);
    std::__cxx11::string::_M_assign((string *)pmVar5);
LAB_0032fe34:
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&path);
    psVar6 = local_a8;
  }
  else {
    for (pbVar7 = (this->IncludeDirectories).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pcVar8 = local_58,
        pbVar7 != (this->IncludeDirectories).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
      std::__cxx11::string::string((string *)&path,(string *)pbVar7);
      if ((path._M_string_length != 0) && (path._M_dataplus._M_p[path._M_string_length - 1] != '/'))
      {
        std::operator+(&local_80,&path,"/");
        std::__cxx11::string::operator=((string *)&path,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
      }
      std::operator+(&local_80,&path,fname);
      std::__cxx11::string::operator=((string *)&path,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      bVar1 = cmsys::SystemTools::FileExists(path._M_dataplus._M_p,true);
      if ((bVar1) && (bVar1 = cmsys::SystemTools::FileIsDirectory(&path), !bVar1)) {
        cmsys::SystemTools::CollapseFullPath(local_a8,&path);
        pcVar8 = "";
        if (local_58 != (char *)0x0) {
          pcVar8 = local_58;
        }
        std::__cxx11::string::string((string *)&local_80,pcVar8,&local_aa);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 ::operator[](local_60,&local_80);
        std::__cxx11::string::string((string *)&local_50,fname,&local_a9);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar4,&local_50);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        goto LAB_0032fe2a;
      }
      std::__cxx11::string::~string((string *)&path);
    }
    if (local_58 != (char *)0x0) {
      std::__cxx11::string::string((string *)&path,local_58,(allocator *)&local_80);
      if ((path._M_string_length != 0) && (path._M_dataplus._M_p[path._M_string_length - 1] != '/'))
      {
        std::operator+(&local_80,&path,"/");
        std::__cxx11::string::operator=((string *)&path,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
      }
      std::operator+(&local_80,&path,fname);
      std::__cxx11::string::operator=((string *)&path,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      bVar1 = cmsys::SystemTools::FileExists(path._M_dataplus._M_p,true);
      if ((bVar1) && (bVar1 = cmsys::SystemTools::FileIsDirectory(&path), !bVar1)) {
        cmsys::SystemTools::CollapseFullPath(local_a8,&path);
        std::__cxx11::string::string((string *)&local_80,pcVar8,&local_aa);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 ::operator[](local_60,&local_80);
        std::__cxx11::string::string((string *)&local_50,fname,&local_a9);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar4,&local_50);
        std::__cxx11::string::_M_assign((string *)pmVar5);
LAB_0032fe2a:
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_0032fe34;
      }
      std::__cxx11::string::~string((string *)&path);
    }
    psVar6 = local_a8;
    std::__cxx11::string::string((string *)local_a8,fname,(allocator *)&path);
  }
  return psVar6;
}

Assistant:

std::string FullPath(const char *fname, const char *extraPath)
  {
    DirectoryToFileToPathMapType::iterator m;
    if(extraPath)
      {
      m = this->DirectoryToFileToPathMap.find(extraPath);
      }
    else
      {
      m = this->DirectoryToFileToPathMap.find("");
      }

    if(m != this->DirectoryToFileToPathMap.end())
      {
      FileToPathMapType& map = m->second;
      FileToPathMapType::iterator p = map.find(fname);
      if(p != map.end())
        {
        return p->second;
        }
      }

    if(cmSystemTools::FileExists(fname, true))
      {
      std::string fp = cmSystemTools::CollapseFullPath(fname);
      this->DirectoryToFileToPathMap[extraPath? extraPath: ""][fname] = fp;
      return fp;
      }

    for(std::vector<std::string>::iterator i =
        this->IncludeDirectories.begin();
        i != this->IncludeDirectories.end(); ++i)
      {
      std::string path = *i;
      if (!path.empty() && path[path.size() - 1] != '/')
        {
        path = path + "/";
        }
      path = path + fname;
      if(cmSystemTools::FileExists(path.c_str(), true)
         && !cmSystemTools::FileIsDirectory(path))
        {
        std::string fp = cmSystemTools::CollapseFullPath(path);
        this->DirectoryToFileToPathMap[extraPath? extraPath: ""][fname] = fp;
        return fp;
        }
      }

    if (extraPath)
      {
      std::string path = extraPath;
      if (!path.empty() && path[path.size() - 1] != '/')
        {
        path = path + "/";
        }
      path = path + fname;
      if(cmSystemTools::FileExists(path.c_str(), true)
         && !cmSystemTools::FileIsDirectory(path))
        {
        std::string fp = cmSystemTools::CollapseFullPath(path);
        this->DirectoryToFileToPathMap[extraPath][fname] = fp;
        return fp;
        }
      }

    // Couldn't find the file.
    return std::string(fname);
  }